

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestPartResult
          (StreamingListener *this,TestPartResult *test_part_result)

{
  StreamingListener *pSVar1;
  char *in_RDX;
  char *str;
  StreamingListener *this_00;
  int local_11c;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  pSVar1 = (StreamingListener *)(test_part_result->file_name_)._M_string_length;
  if (pSVar1 != (StreamingListener *)0x0) {
    pSVar1 = (StreamingListener *)(test_part_result->file_name_)._M_dataplus._M_p;
  }
  this_00 = (StreamingListener *)0x12ce66;
  if (pSVar1 != (StreamingListener *)0x0) {
    this_00 = pSVar1;
  }
  UrlEncode_abi_cxx11_(&local_38,this_00,in_RDX);
  std::operator+(&local_d8,"event=TestPartResult&file=",&local_38);
  std::operator+(&local_b8,&local_d8,"&line=");
  local_11c = test_part_result->line_number_;
  StreamableToString<int>(&local_f8,&local_11c);
  std::operator+(&local_98,&local_b8,&local_f8);
  std::operator+(&local_78,&local_98,"&message=");
  UrlEncode_abi_cxx11_
            (&local_118,(StreamingListener *)(test_part_result->message_)._M_dataplus._M_p,str);
  std::operator+(&local_58,&local_78,&local_118);
  SendLn(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void OnTestPartResult(const TestPartResult& test_part_result) {
    const char* file_name = test_part_result.file_name();
    if (file_name == NULL)
      file_name = "";
    SendLn("event=TestPartResult&file=" + UrlEncode(file_name) +
           "&line=" + StreamableToString(test_part_result.line_number()) +
           "&message=" + UrlEncode(test_part_result.message()));
  }